

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void prepare_coeffs_8tap_sse2(InterpFilterParams *filter_params,int32_t subpel_q4,__m128i *coeffs)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int16_t *piVar3;
  undefined4 *in_RDX;
  uint in_ESI;
  InterpFilterParams *in_RDI;
  __m128i coeff;
  int16_t *filter;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  piVar3 = av1_get_interp_filter_subpel_kernel(in_RDI,in_ESI & 0xf);
  uVar1 = *(undefined8 *)piVar3;
  uVar2 = *(undefined8 *)(piVar3 + 4);
  local_38 = (undefined4)uVar1;
  *in_RDX = local_38;
  in_RDX[1] = local_38;
  in_RDX[2] = local_38;
  in_RDX[3] = local_38;
  uStack_34 = (undefined4)((ulong)uVar1 >> 0x20);
  in_RDX[4] = uStack_34;
  in_RDX[5] = uStack_34;
  in_RDX[6] = uStack_34;
  in_RDX[7] = uStack_34;
  uStack_30 = (undefined4)uVar2;
  in_RDX[8] = uStack_30;
  in_RDX[9] = uStack_30;
  in_RDX[10] = uStack_30;
  in_RDX[0xb] = uStack_30;
  uStack_2c = (undefined4)((ulong)uVar2 >> 0x20);
  in_RDX[0xc] = uStack_2c;
  in_RDX[0xd] = uStack_2c;
  in_RDX[0xe] = uStack_2c;
  in_RDX[0xf] = uStack_2c;
  return;
}

Assistant:

static inline void prepare_coeffs_8tap_sse2(
    const InterpFilterParams *const filter_params, const int32_t subpel_q4,
    __m128i *const coeffs /* [4] */) {
  const int16_t *filter = av1_get_interp_filter_subpel_kernel(
      filter_params, subpel_q4 & SUBPEL_MASK);

  const __m128i coeff = _mm_loadu_si128((__m128i *)filter);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs[0] = _mm_shuffle_epi32(coeff, 0x00);
  // coeffs 2 3 2 3 2 3 2 3
  coeffs[1] = _mm_shuffle_epi32(coeff, 0x55);
  // coeffs 4 5 4 5 4 5 4 5
  coeffs[2] = _mm_shuffle_epi32(coeff, 0xaa);
  // coeffs 6 7 6 7 6 7 6 7
  coeffs[3] = _mm_shuffle_epi32(coeff, 0xff);
}